

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

sexp sexp_double_to_ratio(sexp ctx,double f)

{
  sexp psVar1;
  ulong uVar2;
  sexp a;
  uint uVar3;
  bool bVar4;
  double dVar5;
  sexp scale;
  sexp whole;
  sexp local_80;
  double local_78;
  undefined8 uStack_70;
  sexp local_68;
  double local_60;
  sexp local_58;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  sexp_gc_var_t local_30;
  
  local_80 = (sexp)0x43e;
  local_58 = (sexp)0x43e;
  local_68 = (sexp)0x43e;
  local_60 = f;
  local_78 = trunc(f);
  if ((local_78 == local_60) && (!NAN(local_78) && !NAN(local_60))) {
    psVar1 = sexp_double_to_bignum(ctx,local_60);
    psVar1 = sexp_bignum_normalize(psVar1);
    return psVar1;
  }
  local_50.var = &local_80;
  local_30.next = &local_50;
  local_50.next = (ctx->value).context.saves;
  local_30.var = &local_58;
  local_40.next = &local_30;
  local_40.var = &local_68;
  (ctx->value).context.saves = &local_40;
  local_58 = sexp_double_to_bignum(ctx,local_78);
  psVar1 = sexp_fixnum_to_bignum(ctx,(sexp)&DAT_00000001);
  local_68 = (sexp)&DAT_00000003;
  local_78 = ABS(local_60 - local_78);
  uStack_70 = 0;
  local_80 = psVar1;
  dVar5 = trunc(local_78);
  if ((local_78 != dVar5) || (NAN(local_78) || NAN(dVar5))) {
    uVar3 = 0;
    do {
      psVar1 = sexp_bignum_fxmul(ctx,(sexp)0x0,local_80,10,0);
      local_78 = local_78 * 10.0;
      local_80 = psVar1;
      dVar5 = trunc(local_78 / 10.0);
      dVar5 = local_78 - dVar5 * 10.0;
      uVar2 = (ulong)dVar5;
      local_80 = sexp_bignum_fxadd(ctx,psVar1,
                                   (long)(dVar5 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f |
                                   uVar2);
      dVar5 = trunc(local_78);
      local_78 = local_78 - dVar5;
      a = sexp_mul(ctx,local_68,(sexp)&DAT_00000015);
      local_68 = a;
      dVar5 = trunc(local_78);
      psVar1 = local_80;
      if ((local_78 == dVar5) && (!NAN(local_78) && !NAN(dVar5))) break;
      bVar4 = uVar3 < 0xe;
      uVar3 = uVar3 + 1;
    } while (bVar4);
  }
  else {
    a = (sexp)&DAT_00000003;
  }
  (psVar1->value).flonum_bits[0] = -(local_60 < 0.0) | 1;
  psVar1 = sexp_bignum_normalize(psVar1);
  local_80 = psVar1;
  local_68 = sexp_bignum_normalize(a);
  local_80 = sexp_make_ratio(ctx,psVar1,local_68);
  local_80 = sexp_ratio_normalize(ctx,local_80,(sexp)&DAT_0000003e);
  psVar1 = sexp_add(ctx,local_80,local_58);
  (ctx->value).context.saves = local_50.next;
  return psVar1;
}

Assistant:

sexp sexp_double_to_ratio (sexp ctx, double f) {
  int sign, i;
  sexp_gc_var3(res, whole, scale);
  if (f == trunc(f))
    return sexp_bignum_normalize(sexp_double_to_bignum(ctx, f));
  sexp_gc_preserve3(ctx, res, whole, scale);
  whole = sexp_double_to_bignum(ctx, trunc(f));
  res = sexp_fixnum_to_bignum(ctx, SEXP_ZERO);
  scale = SEXP_ONE;
  sign = (f < 0 ? -1 : 1);
  for (i=0, f=fabs(f-trunc(f)); f != trunc(f) && i < 15; i++) {
    res = sexp_bignum_fxmul(ctx, NULL, res, 10, 0);
    f = f * 10;
    res = sexp_bignum_fxadd(ctx, res, (sexp_uint_t)double_10s_digit(f));
    f = f - trunc(f);
    scale = sexp_mul(ctx, scale, SEXP_TEN);
  }
  sexp_bignum_sign(res) = sign;
  res = sexp_bignum_normalize(res);
  scale = sexp_bignum_normalize(scale);
  res = sexp_make_ratio(ctx, res, scale);
  res = sexp_ratio_normalize(ctx, res, SEXP_FALSE);
  res = sexp_add(ctx, res, whole);
  sexp_gc_release3(ctx);
  return res;
}